

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VisionFeaturePrintValidatorTests.cpp
# Opt level: O0

int testVisionFeatureObjectPrintBasic(void)

{
  bool bVar1;
  ImageFeatureType *this;
  FeatureType *this_00;
  ArrayFeatureType *pAVar2;
  FeatureType *this_01;
  FeatureType *this_02;
  ModelDescription *this_03;
  FeatureDescription *this_04;
  FeatureDescription *this_05;
  ostream *poVar3;
  undefined1 local_1a8 [40];
  undefined1 local_180 [40];
  undefined1 local_158 [40];
  Result local_130;
  VisionFeaturePrint_Objects *objects;
  __aligned_membuf<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_d8;
  VisionFeaturePrint *preprocessing;
  undefined1 local_c8 [48];
  Model model;
  FeatureDescription *output2;
  FeatureDescription *output1;
  FeatureDescription *input;
  ModelDescription *description;
  FeatureType *output2FeatureType;
  ArrayFeatureType *output2ArrayFeatureType;
  FeatureType *output1FeatureType;
  ArrayFeatureType *output1ArrayFeatureType;
  FeatureType *inputFeatureType;
  ImageFeatureType *inputImageFeatureType;
  
  this = (ImageFeatureType *)operator_new(0x38);
  CoreML::Specification::ImageFeatureType::ImageFeatureType(this);
  this_00 = (FeatureType *)operator_new(0x28);
  CoreML::Specification::FeatureType::FeatureType(this_00);
  CoreML::Specification::FeatureType::set_allocated_imagetype(this_00,this);
  pAVar2 = (ArrayFeatureType *)operator_new(0x48);
  CoreML::Specification::ArrayFeatureType::ArrayFeatureType(pAVar2);
  this_01 = (FeatureType *)operator_new(0x28);
  CoreML::Specification::FeatureType::FeatureType(this_01);
  CoreML::Specification::FeatureType::set_allocated_multiarraytype(this_01,pAVar2);
  pAVar2 = (ArrayFeatureType *)operator_new(0x48);
  CoreML::Specification::ArrayFeatureType::ArrayFeatureType(pAVar2);
  this_02 = (FeatureType *)operator_new(0x28);
  CoreML::Specification::FeatureType::FeatureType(this_02);
  CoreML::Specification::FeatureType::set_allocated_multiarraytype(this_02,pAVar2);
  this_03 = (ModelDescription *)operator_new(0x78);
  CoreML::Specification::ModelDescription::ModelDescription(this_03);
  this_04 = CoreML::Specification::ModelDescription::add_input(this_03);
  this_05 = CoreML::Specification::ModelDescription::add_output(this_03);
  model._40_8_ = CoreML::Specification::ModelDescription::add_output(this_03);
  CoreML::Specification::FeatureDescription::set_allocated_type(this_04,this_00);
  CoreML::Specification::FeatureDescription::set_allocated_type(this_05,this_01);
  CoreML::Specification::FeatureDescription::set_allocated_type
            ((FeatureDescription *)model._40_8_,this_02);
  CoreML::Specification::FeatureDescription::set_name(this_05,"a");
  CoreML::Specification::FeatureDescription::set_name((FeatureDescription *)model._40_8_,"b");
  CoreML::Specification::Model::Model((Model *)(local_c8 + 0x28));
  CoreML::Specification::Model::set_allocated_description((Model *)(local_c8 + 0x28),this_03);
  CoreML::validate<(MLModelType)2002>((Result_conflict1 *)local_c8,(Model *)(local_c8 + 0x28));
  bVar1 = CoreML::Result::good((Result *)local_c8);
  if (bVar1) {
    poVar3 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/VisionFeaturePrintValidatorTests.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x57);
    poVar3 = std::operator<<(poVar3,": error: ");
    poVar3 = std::operator<<(poVar3,"!((result).good())");
    poVar3 = std::operator<<(poVar3," was false, expected true.");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    inputImageFeatureType._4_4_ = 1;
  }
  else {
    local_d8._M_storage =
         (uchar  [8])
         CoreML::Specification::Model::mutable_visionfeatureprint((Model *)(local_c8 + 0x28));
    CoreML::validate<(MLModelType)2002>((Result_conflict1 *)&objects,(Model *)(local_c8 + 0x28));
    CoreML::Result::operator=((Result *)local_c8,(Result *)&objects);
    CoreML::Result::~Result((Result *)&objects);
    bVar1 = CoreML::Result::good((Result *)local_c8);
    if (bVar1) {
      poVar3 = std::operator<<((ostream *)&std::cout,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/VisionFeaturePrintValidatorTests.cpp"
                              );
      poVar3 = std::operator<<(poVar3,":");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x5b);
      poVar3 = std::operator<<(poVar3,": error: ");
      poVar3 = std::operator<<(poVar3,"!((result).good())");
      poVar3 = std::operator<<(poVar3," was false, expected true.");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      inputImageFeatureType._4_4_ = 1;
    }
    else {
      local_130.m_message._M_storage._M_storage =
           (uchar  [8])
           CoreML::Specification::CoreMLModels::VisionFeaturePrint::mutable_objects
                     (local_d8._M_storage);
      CoreML::validate<(MLModelType)2002>
                ((Result_conflict1 *)(local_158 + 0x28),(Model *)(local_c8 + 0x28));
      CoreML::Result::operator=((Result *)local_c8,(Result *)(local_158 + 0x28));
      CoreML::Result::~Result((Result *)(local_158 + 0x28));
      bVar1 = CoreML::Result::good((Result *)local_c8);
      if (bVar1) {
        poVar3 = std::operator<<((ostream *)&std::cout,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/VisionFeaturePrintValidatorTests.cpp"
                                );
        poVar3 = std::operator<<(poVar3,":");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x5f);
        poVar3 = std::operator<<(poVar3,": error: ");
        poVar3 = std::operator<<(poVar3,"!((result).good())");
        poVar3 = std::operator<<(poVar3," was false, expected true.");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        inputImageFeatureType._4_4_ = 1;
      }
      else {
        CoreML::Specification::CoreMLModels::VisionFeaturePrint_Objects::set_version
                  ((VisionFeaturePrint_Objects *)local_130.m_message._M_storage._M_storage,
                   VisionFeaturePrint_Objects_ObjectsVersion_OBJECTS_VERSION_1);
        CoreML::validate<(MLModelType)2002>
                  ((Result_conflict1 *)local_158,(Model *)(local_c8 + 0x28));
        CoreML::Result::operator=((Result *)local_c8,(Result *)local_158);
        CoreML::Result::~Result((Result *)local_158);
        bVar1 = CoreML::Result::good((Result *)local_c8);
        if (bVar1) {
          poVar3 = std::operator<<((ostream *)&std::cout,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/VisionFeaturePrintValidatorTests.cpp"
                                  );
          poVar3 = std::operator<<(poVar3,":");
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,99);
          poVar3 = std::operator<<(poVar3,": error: ");
          poVar3 = std::operator<<(poVar3,"!((result).good())");
          poVar3 = std::operator<<(poVar3," was false, expected true.");
          std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
          inputImageFeatureType._4_4_ = 1;
        }
        else {
          CoreML::Specification::CoreMLModels::VisionFeaturePrint_Objects::add_output
                    ((VisionFeaturePrint_Objects *)local_130.m_message._M_storage._M_storage,"a");
          CoreML::validate<(MLModelType)2002>
                    ((Result_conflict1 *)local_180,(Model *)(local_c8 + 0x28));
          CoreML::Result::operator=((Result *)local_c8,(Result *)local_180);
          CoreML::Result::~Result((Result *)local_180);
          bVar1 = CoreML::Result::good((Result *)local_c8);
          if (bVar1) {
            poVar3 = std::operator<<((ostream *)&std::cout,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/VisionFeaturePrintValidatorTests.cpp"
                                    );
            poVar3 = std::operator<<(poVar3,":");
            poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x67);
            poVar3 = std::operator<<(poVar3,": error: ");
            poVar3 = std::operator<<(poVar3,"!((result).good())");
            poVar3 = std::operator<<(poVar3," was false, expected true.");
            std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
            inputImageFeatureType._4_4_ = 1;
          }
          else {
            CoreML::Specification::CoreMLModels::VisionFeaturePrint_Objects::add_output
                      ((VisionFeaturePrint_Objects *)local_130.m_message._M_storage._M_storage,"b");
            CoreML::validate<(MLModelType)2002>
                      ((Result_conflict1 *)local_1a8,(Model *)(local_c8 + 0x28));
            CoreML::Result::operator=((Result *)local_c8,(Result *)local_1a8);
            CoreML::Result::~Result((Result *)local_1a8);
            bVar1 = CoreML::Result::good((Result *)local_c8);
            if (bVar1) {
              inputImageFeatureType._4_4_ = 0;
            }
            else {
              poVar3 = std::operator<<((ostream *)&std::cout,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/VisionFeaturePrintValidatorTests.cpp"
                                      );
              poVar3 = std::operator<<(poVar3,":");
              poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x6a);
              poVar3 = std::operator<<(poVar3,": error: ");
              poVar3 = std::operator<<(poVar3,"(result).good()");
              poVar3 = std::operator<<(poVar3," was false, expected true.");
              std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
              inputImageFeatureType._4_4_ = 1;
            }
          }
        }
      }
    }
  }
  preprocessing._4_4_ = 1;
  CoreML::Result::~Result((Result *)local_c8);
  CoreML::Specification::Model::~Model((Model *)(local_c8 + 0x28));
  return inputImageFeatureType._4_4_;
}

Assistant:

int testVisionFeatureObjectPrintBasic() {

    Specification::ImageFeatureType* inputImageFeatureType = new Specification::ImageFeatureType();
    Specification::FeatureType* inputFeatureType = new Specification::FeatureType();
    inputFeatureType->set_allocated_imagetype(inputImageFeatureType);

    Specification::ArrayFeatureType* output1ArrayFeatureType = new Specification::ArrayFeatureType();
    Specification::FeatureType* output1FeatureType = new Specification::FeatureType();
    output1FeatureType->set_allocated_multiarraytype(output1ArrayFeatureType);
    
    Specification::ArrayFeatureType* output2ArrayFeatureType = new Specification::ArrayFeatureType();
    Specification::FeatureType* output2FeatureType = new Specification::FeatureType();
    output2FeatureType->set_allocated_multiarraytype(output2ArrayFeatureType);
    
    Specification::ModelDescription* description = new Specification::ModelDescription();
    Specification::FeatureDescription* input = description->add_input();
    Specification::FeatureDescription* output1 = description->add_output();
    Specification::FeatureDescription* output2 = description->add_output();
    input->set_allocated_type(inputFeatureType);
    output1->set_allocated_type(output1FeatureType);
    output2->set_allocated_type(output2FeatureType);

    output1->set_name("a");
    output2->set_name("b");

    Specification::Model model;
    model.set_allocated_description(description);

    Result result = validate<MLModelType_visionFeaturePrint>(model);
    ML_ASSERT_BAD(result);

    auto *preprocessing = model.mutable_visionfeatureprint();
    result = validate<MLModelType_visionFeaturePrint>(model);
    ML_ASSERT_BAD(result);

    auto objects = preprocessing->mutable_objects();
    result = validate<MLModelType_visionFeaturePrint>(model);
    ML_ASSERT_BAD(result);

    objects->set_version(Specification::CoreMLModels::VisionFeaturePrint_Objects_ObjectsVersion_OBJECTS_VERSION_1);
    result = validate<MLModelType_visionFeaturePrint>(model);
    ML_ASSERT_BAD(result);

    objects->add_output("a");
    result = validate<MLModelType_visionFeaturePrint>(model);
    ML_ASSERT_BAD(result);
    objects->add_output("b");
    result = validate<MLModelType_visionFeaturePrint>(model);
    ML_ASSERT_GOOD(result);

    return 0;
}